

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndFrame(void)

{
  int *piVar1;
  ImVector<ImGuiViewport_*> *pIVar2;
  undefined8 *puVar3;
  ImVec2 IVar4;
  uint uVar5;
  _func_void_ImGuiViewport_ptr_ImVec2 *p_Var6;
  ImGuiViewportP *pIVar7;
  ImVec2 IVar8;
  ImGuiWindow *pIVar9;
  char *__s1;
  unsigned_short *puVar10;
  bool bVar11;
  ImVec2 IVar12;
  undefined1 auVar13 [16];
  int iVar14;
  undefined8 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  ImGuiContext *pIVar20;
  ImGuiContext *pIVar21;
  ImU32 IVar22;
  ImGuiWindow *pIVar23;
  ImDrawList *pIVar24;
  ImGuiWindow **ppIVar25;
  ImGuiViewport **ppIVar26;
  ImGuiViewport **ppIVar27;
  ImGuiWindow **ppIVar28;
  unsigned_short *__dest;
  byte bVar29;
  char *pcVar30;
  char *label;
  ImGuiWindow *pIVar31;
  byte bVar32;
  int iVar33;
  ImGuiContext *ctx;
  ulong uVar34;
  ImGuiContext *g;
  long lVar35;
  ulong uVar36;
  uint uVar37;
  int iVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  ImRect outer;
  ImRect inner;
  ImVec4 local_98;
  undefined1 local_88 [16];
  ImVec2 local_78;
  undefined8 uStack_70;
  ImVec2 local_68;
  ImVec2 IStack_60;
  ImVec2 local_58;
  undefined8 uStack_50;
  ImVec2 local_48;
  undefined8 uStack_40;
  
  pIVar21 = GImGui;
  if (GImGui->FrameCountEnded == GImGui->FrameCount) {
    return;
  }
  p_Var6 = (GImGui->PlatformIO).Platform_SetImeInputPos;
  if (p_Var6 != (_func_void_ImGuiViewport_ptr_ImVec2 *)0x0) {
    fVar39 = (GImGui->PlatformImeLastPos).x;
    if ((((fVar39 == 3.4028235e+38) && (!NAN(fVar39))) ||
        (fVar40 = (GImGui->PlatformImePos).y - (GImGui->PlatformImeLastPos).y,
        fVar39 = (GImGui->PlatformImePos).x - fVar39, 0.0001 < fVar39 * fVar39 + fVar40 * fVar40))
       && ((pIVar7 = GImGui->PlatformImePosViewport, pIVar7 != (ImGuiViewportP *)0x0 &&
           (pIVar7->PlatformWindowCreated == true)))) {
      (*p_Var6)(&pIVar7->super_ImGuiViewport,GImGui->PlatformImePos);
      pIVar21->PlatformImeLastPos = pIVar21->PlatformImePos;
      pIVar21->PlatformImePosViewport = (ImGuiViewportP *)0x0;
    }
  }
  pIVar20 = GImGui;
  iVar38 = (GImGui->CurrentWindowStack).Size;
  while (1 < iVar38) {
    End();
    iVar38 = (pIVar20->CurrentWindowStack).Size;
  }
  pIVar21->WithinFrameScopeWithImplicitWindow = false;
  pIVar23 = pIVar21->CurrentWindow;
  if ((pIVar23 != (ImGuiWindow *)0x0) && (pIVar23->WriteAccessed == false)) {
    pIVar23->Active = false;
  }
  End();
  pIVar20 = GImGui;
  pIVar23 = GetTopMostPopupModal();
  IVar8 = (ImVec2)pIVar20->NavWindowingTargetAnim;
  if (pIVar23 != (ImGuiWindow *)0x0 || IVar8 != (ImVec2)0x0) {
    iVar38 = (pIVar20->Viewports).Size;
    local_78 = IVar8;
    if (0 < iVar38) {
      lVar35 = 0;
      local_88._0_8_ = (0x31 - (ulong)(pIVar23 == (ImGuiWindow *)0x0)) * 0x10;
      do {
        pIVar7 = (pIVar20->Viewports).Data[lVar35];
        if ((((pIVar23 == (ImGuiWindow *)0x0) || (pIVar7 != pIVar23->Viewport)) &&
            ((pIVar20->NavWindowingList == (ImGuiWindow *)0x0 ||
             (pIVar7 != pIVar20->NavWindowingList->Viewport)))) &&
           ((pIVar20->NavWindowingTargetAnim == (ImGuiWindow *)0x0 ||
            (pIVar7 != pIVar20->NavWindowingTargetAnim->Viewport)))) {
          pIVar24 = GetViewportDrawList(pIVar7,1,"##Foreground");
          puVar3 = (undefined8 *)((long)&(GImGui->Style).Colors[0].x + local_88._0_8_);
          local_98._0_8_ = *puVar3;
          uVar15 = puVar3[1];
          local_98.w = (float)((ulong)uVar15 >> 0x20);
          local_98.z = (float)uVar15;
          local_98.w = pIVar20->DimBgRatio * (GImGui->Style).Alpha * local_98.w;
          IVar22 = ColorConvertFloat4ToU32(&local_98);
          IVar8 = (pIVar7->super_ImGuiViewport).Pos;
          IVar4 = (pIVar7->super_ImGuiViewport).Size;
          local_98.y = IVar4.y + IVar8.y;
          local_98.x = IVar4.x + IVar8.x;
          ImDrawList::AddRectFilled
                    (pIVar24,&(pIVar7->super_ImGuiViewport).Pos,(ImVec2 *)&local_98,IVar22,0.0,0xf);
          iVar38 = (pIVar20->Viewports).Size;
        }
        lVar35 = lVar35 + 1;
      } while (lVar35 < iVar38);
    }
    if (local_78 != (ImVec2)0x0) {
      pIVar23 = pIVar20->NavWindowingTargetAnim;
      pIVar9 = pIVar23->RootWindow;
      while (pIVar31 = pIVar9, iVar38 = (pIVar31->DC).ChildWindows.Size, 0 < iVar38) {
        iVar33 = iVar38 + 1;
        ppIVar25 = (pIVar31->DC).ChildWindows.Data + (iVar38 - 1);
        while ((pIVar9 = *ppIVar25, pIVar9->Active != true || (pIVar9->Hidden == true))) {
          iVar33 = iVar33 + -1;
          ppIVar25 = ppIVar25 + -1;
          if (iVar33 < 2) goto LAB_0015b263;
        }
      }
LAB_0015b263:
      pIVar24 = pIVar31->DrawList;
      ImDrawList::PushClipRectFullScreen(pIVar24);
      pIVar9 = pIVar23->RootWindowDockStop;
      if (((pIVar9->field_0x43a & 1) != 0) && (pIVar31 = pIVar23->RootWindow, pIVar31 != pIVar9)) {
        local_78 = pIVar31->Pos;
        uStack_70 = 0;
        local_88._4_4_ = (pIVar31->Size).y + local_78.y;
        local_88._0_4_ = (pIVar31->Size).x + local_78.x;
        local_88._8_8_ = 0;
        local_58 = pIVar9->Pos;
        uStack_50 = 0;
        local_98.x = (GImGui->Style).Colors[0x30].x;
        local_98.y = (GImGui->Style).Colors[0x30].y;
        uVar16 = (GImGui->Style).Colors[0x30].z;
        uVar17 = (GImGui->Style).Colors[0x30].w;
        local_48.y = (pIVar9->Size).y + local_58.y;
        local_48.x = (pIVar9->Size).x + local_58.x;
        uStack_40 = 0;
        local_98.w = pIVar20->DimBgRatio * (GImGui->Style).Alpha * (float)uVar17;
        local_98.z = (float)uVar16;
        IVar22 = ColorConvertFloat4ToU32(&local_98);
        auVar13 = local_88;
        outer.Max.x = (float)local_88._0_4_;
        outer.Max.y = (float)local_88._4_4_;
        outer.Min = local_78;
        inner.Max = local_48;
        inner.Min = local_58;
        local_88 = auVar13;
        RenderRectFilledWithHole(pIVar24,outer,inner,IVar22,(pIVar20->Style).WindowRounding);
      }
      fVar39 = pIVar23->WindowRounding;
      fVar40 = (pIVar20->Style).WindowRounding;
      uVar37 = -(uint)(fVar40 <= fVar39);
      local_88 = ZEXT416(~uVar37 & (uint)fVar40 | uVar37 & (uint)fVar39);
      local_68.x = (pIVar23->Pos).x;
      local_68.y = (pIVar23->Pos).y;
      fVar41 = (pIVar23->Size).x + local_68.x;
      fVar42 = (pIVar23->Size).y + local_68.y;
      fVar40 = pIVar20->FontSize;
      local_68.x = local_68.x - fVar40;
      local_68.y = local_68.y - fVar40;
      IStack_60.x = fVar41 + fVar40;
      IStack_60.y = fVar42 + fVar40;
      pIVar7 = pIVar23->Viewport;
      IVar8 = (pIVar7->super_ImGuiViewport).Pos;
      fVar43 = IVar8.x;
      fVar44 = IVar8.y;
      if ((local_68.x <= fVar43) && (local_68.y <= fVar44)) {
        IVar8 = (pIVar7->super_ImGuiViewport).Size;
        iVar38 = -(uint)(fVar43 + IVar8.x <= fVar41 + fVar40);
        iVar33 = -(uint)(fVar44 + IVar8.y <= fVar42 + fVar40);
        auVar13._4_4_ = iVar38;
        auVar13._0_4_ = iVar38;
        auVar13._8_4_ = iVar33;
        auVar13._12_4_ = iVar33;
        uVar37 = movmskpd((int)pIVar7,auVar13);
        if (((uVar37 & 1) != 0) && ((byte)((byte)uVar37 >> 1) != 0)) {
          fVar40 = -1.0 - fVar40;
          local_68.x = local_68.x - fVar40;
          local_68.y = local_68.y - fVar40;
          IStack_60.x = fVar40 + IStack_60.x;
          IStack_60.y = fVar40 + IStack_60.y;
          local_88 = ZEXT416((uint)fVar39);
        }
      }
      local_98.x = (GImGui->Style).Colors[0x2f].x;
      local_98.y = (GImGui->Style).Colors[0x2f].y;
      uVar18 = (GImGui->Style).Colors[0x2f].z;
      uVar19 = (GImGui->Style).Colors[0x2f].w;
      local_98.w = pIVar20->NavWindowingHighlightAlpha * (GImGui->Style).Alpha * (float)uVar19;
      local_98.z = (float)uVar18;
      IVar22 = ColorConvertFloat4ToU32(&local_98);
      ImDrawList::AddRect(pIVar24,&local_68,&IStack_60,IVar22,(float)local_88._0_4_,-1,3.0);
      ImDrawList::PopClipRect(pIVar24);
    }
  }
  pIVar20 = GImGui;
  if ((pIVar21->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15)) {
    if (GImGui->NavWindowingList == (ImGuiWindow *)0x0) {
      IVar22 = ImHashStr("###NavWindowingList",0,0);
      pIVar23 = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(&pIVar20->WindowsById,IVar22);
      pIVar20->NavWindowingList = pIVar23;
    }
    pIVar7 = *(pIVar20->Viewports).Data;
    IVar8 = (pIVar7->super_ImGuiViewport).Size;
    IVar4.y = IVar8.y * 0.2;
    IVar4.x = IVar8.x * 0.2;
    (pIVar20->NextWindowData).SizeConstraintRect.Min = IVar4;
    (pIVar20->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
    (pIVar20->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
    (pIVar20->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
    (pIVar20->NextWindowData).SizeCallbackUserData = (void *)0x0;
    IVar8 = (pIVar7->super_ImGuiViewport).Pos;
    IVar4 = (pIVar7->super_ImGuiViewport).Size;
    (pIVar20->NextWindowData).Flags = (pIVar20->NextWindowData).Flags | 0x11;
    IVar12.y = IVar4.y * 0.5 + IVar8.y;
    IVar12.x = IVar4.x * 0.5 + IVar8.x;
    (pIVar20->NextWindowData).PosVal = IVar12;
    (pIVar20->NextWindowData).PosPivotVal.x = 0.5;
    (pIVar20->NextWindowData).PosPivotVal.y = 0.5;
    (pIVar20->NextWindowData).PosCond = 1;
    (pIVar20->NextWindowData).PosUndock = true;
    IVar8 = (pIVar20->Style).WindowPadding;
    fVar39 = IVar8.x;
    fVar40 = IVar8.y;
    local_98.y = fVar40 + fVar40;
    local_98.x = fVar39 + fVar39;
    PushStyleVar(1,(ImVec2 *)&local_98);
    Begin("###NavWindowingList",(bool *)0x0,0xc1347);
    lVar35 = (long)(pIVar20->WindowsFocusOrder).Size;
    if (0 < lVar35) {
      do {
        pIVar23 = (pIVar20->WindowsFocusOrder).Data[lVar35 + -1];
        if (((pIVar23->Active == true) && (pIVar23->RootWindowDockStop == pIVar23)) &&
           (uVar37 = pIVar23->Flags, (uVar37 >> 0x13 & 1) == 0)) {
          __s1 = pIVar23->Name;
          pcVar30 = __s1;
          if (__s1 == (char *)0xffffffffffffffff) {
LAB_0015b5f6:
            label = "(Popup)";
            if ((uVar37 >> 0x1a & 1) == 0) {
              if ((uVar37 >> 10 & 1) != 0) {
                iVar38 = strcmp(__s1,"##MainMenuBar");
                label = "(Main menu bar)";
                if (iVar38 == 0) goto LAB_0015b636;
              }
              label = "(Dock node)";
              if (pIVar23->DockNodeAsHost == (ImGuiDockNode *)0x0) {
                label = "(Untitled)";
              }
            }
          }
          else {
            do {
              if (*pcVar30 == '#') {
                if (pcVar30[1] == '#') goto LAB_0015b5ec;
              }
              else if (*pcVar30 == '\0') goto LAB_0015b5ec;
              pcVar30 = pcVar30 + 1;
            } while (pcVar30 != (char *)0xffffffffffffffff);
            pcVar30 = (char *)0xffffffffffffffff;
LAB_0015b5ec:
            label = __s1;
            if (__s1 == pcVar30) goto LAB_0015b5f6;
          }
LAB_0015b636:
          local_98.x = 0.0;
          local_98.y = 0.0;
          Selectable(label,pIVar20->NavWindowingTarget == pIVar23,0,(ImVec2 *)&local_98);
        }
        bVar11 = 1 < lVar35;
        lVar35 = lVar35 + -1;
      } while (bVar11);
    }
    End();
    PopStyleVar(1);
  }
  pIVar20 = GImGui;
  if (GImGui->CurrentViewport != (ImGuiViewportP *)0x0) {
    GImGui->CurrentDpiScale = 1.0;
    pIVar20->CurrentViewport = (ImGuiViewportP *)0x0;
  }
  bVar29 = pIVar21->DragDropActive;
  iVar38 = pIVar21->FrameCount;
  if ((bool)bVar29 != true) goto LAB_0015b712;
  if ((pIVar21->DragDropPayload).DataFrameCount + 1 < iVar38) {
    if ((pIVar21->DragDropSourceFlags & 0x20) == 0) {
      bVar32 = (pIVar20->IO).MouseDown[pIVar21->DragDropMouseButton] ^ 1;
      goto LAB_0015b6f4;
    }
  }
  else {
    bVar32 = 0;
LAB_0015b6f4:
    if ((bVar32 == 0) && ((pIVar21->DragDropPayload).Delivery == false)) goto LAB_0015b712;
  }
  ClearDragDrop();
  bVar29 = pIVar21->DragDropActive;
  iVar38 = pIVar21->FrameCount;
LAB_0015b712:
  if (((bVar29 & 1) != 0) && (pIVar21->DragDropSourceFrameCount < iVar38)) {
    pIVar21->DragDropWithinSourceOrTarget = true;
    SetTooltip("...");
    pIVar21->DragDropWithinSourceOrTarget = false;
    iVar38 = pIVar21->FrameCount;
  }
  pIVar21->WithinFrameScope = false;
  pIVar21->FrameCountEnded = iVar38;
  UpdateMouseMovingWindowEndFrame();
  pIVar20 = GImGui;
  (GImGui->PlatformIO).MainViewport = &(*(GImGui->Viewports).Data)->super_ImGuiViewport;
  if ((pIVar20->PlatformIO).Viewports.Capacity < 0) {
    piVar1 = &(pIVar20->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
    ppIVar26 = (ImGuiViewport **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    ppIVar27 = (pIVar20->PlatformIO).Viewports.Data;
    if (ppIVar27 != (ImGuiViewport **)0x0) {
      memcpy(ppIVar26,ppIVar27,(long)(pIVar20->PlatformIO).Viewports.Size << 3);
      ppIVar27 = (pIVar20->PlatformIO).Viewports.Data;
      if ((ppIVar27 != (ImGuiViewport **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar27,GImAllocatorUserData);
    }
    (pIVar20->PlatformIO).Viewports.Data = ppIVar26;
    (pIVar20->PlatformIO).Viewports.Capacity = 0;
  }
  (pIVar20->PlatformIO).Viewports.Size = 0;
  if (0 < (pIVar20->Viewports).Size) {
    lVar35 = 0;
    do {
      pIVar7 = (pIVar20->Viewports).Data[lVar35];
      pIVar7->LastPos = (pIVar7->super_ImGuiViewport).Pos;
      if ((pIVar7->LastFrameActive < pIVar20->FrameCount) ||
         ((pIVar7->super_ImGuiViewport).Size.x <= 0.0)) {
        if (lVar35 == 0) goto LAB_0015b85c;
      }
      else if ((lVar35 == 0) || (0.0 < (pIVar7->super_ImGuiViewport).Size.y)) {
LAB_0015b85c:
        pIVar23 = pIVar7->Window;
        if ((pIVar23 == (ImGuiWindow *)0x0) ||
           ((pIVar23->Active == true && (pIVar23->Hidden == false)))) {
          iVar38 = (pIVar20->PlatformIO).Viewports.Size;
          if (iVar38 == (pIVar20->PlatformIO).Viewports.Capacity) {
            if (iVar38 == 0) {
              iVar33 = 8;
            }
            else {
              iVar33 = iVar38 / 2 + iVar38;
            }
            iVar14 = iVar38 + 1;
            if (iVar38 + 1 < iVar33) {
              iVar14 = iVar33;
            }
            if (GImGui != (ImGuiContext *)0x0) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + 1;
            }
            ppIVar27 = (ImGuiViewport **)
                       (*GImAllocatorAllocFunc)((long)iVar14 << 3,GImAllocatorUserData);
            ppIVar26 = (pIVar20->PlatformIO).Viewports.Data;
            if (ppIVar26 != (ImGuiViewport **)0x0) {
              memcpy(ppIVar27,ppIVar26,(long)(pIVar20->PlatformIO).Viewports.Size << 3);
              ppIVar26 = (pIVar20->PlatformIO).Viewports.Data;
              if ((ppIVar26 != (ImGuiViewport **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                piVar1 = &(GImGui->IO).MetricsActiveAllocations;
                *piVar1 = *piVar1 + -1;
              }
              (*GImAllocatorFreeFunc)(ppIVar26,GImAllocatorUserData);
            }
            (pIVar20->PlatformIO).Viewports.Data = ppIVar27;
            (pIVar20->PlatformIO).Viewports.Capacity = iVar14;
            iVar38 = (pIVar20->PlatformIO).Viewports.Size;
          }
          else {
            ppIVar27 = (pIVar20->PlatformIO).Viewports.Data;
          }
          ppIVar27[iVar38] = &pIVar7->super_ImGuiViewport;
          pIVar2 = &(pIVar20->PlatformIO).Viewports;
          pIVar2->Size = pIVar2->Size + 1;
        }
      }
      lVar35 = lVar35 + 1;
    } while (lVar35 < (pIVar20->Viewports).Size);
  }
  pIVar7 = *(pIVar20->Viewports).Data;
  (pIVar7->super_ImGuiViewport).PlatformRequestResize = false;
  (pIVar7->super_ImGuiViewport).PlatformRequestClose = false;
  (pIVar7->super_ImGuiViewport).PlatformRequestMove = false;
  uVar37 = (pIVar21->WindowsSortBuffer).Capacity;
  if ((int)uVar37 < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    uVar37 = 0;
    ppIVar28 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    ppIVar25 = (pIVar21->WindowsSortBuffer).Data;
    if (ppIVar25 != (ImGuiWindow **)0x0) {
      memcpy(ppIVar28,ppIVar25,(long)(pIVar21->WindowsSortBuffer).Size << 3);
      ppIVar25 = (pIVar21->WindowsSortBuffer).Data;
      if ((ppIVar25 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar25,GImAllocatorUserData);
    }
    (pIVar21->WindowsSortBuffer).Data = ppIVar28;
    (pIVar21->WindowsSortBuffer).Capacity = 0;
  }
  (pIVar21->WindowsSortBuffer).Size = 0;
  uVar5 = (pIVar21->Windows).Size;
  uVar34 = (ulong)uVar5;
  if ((int)uVar37 < (int)uVar5) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    ppIVar28 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar34 * 8,GImAllocatorUserData);
    ppIVar25 = (pIVar21->WindowsSortBuffer).Data;
    if (ppIVar25 != (ImGuiWindow **)0x0) {
      memcpy(ppIVar28,ppIVar25,(long)(pIVar21->WindowsSortBuffer).Size << 3);
      ppIVar25 = (pIVar21->WindowsSortBuffer).Data;
      if ((ppIVar25 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar25,GImAllocatorUserData);
    }
    (pIVar21->WindowsSortBuffer).Data = ppIVar28;
    (pIVar21->WindowsSortBuffer).Capacity = uVar5;
    uVar34 = (ulong)(uint)(pIVar21->Windows).Size;
    uVar37 = uVar5;
  }
  if ((int)uVar34 == 0) {
    iVar38 = 0;
  }
  else {
    uVar36 = 0;
    do {
      pIVar23 = (pIVar21->Windows).Data[uVar36];
      if ((pIVar23->Active != true) || ((pIVar23->Flags & 0x1000000) == 0)) {
        AddWindowToSortBuffer(&pIVar21->WindowsSortBuffer,pIVar23);
        uVar34 = (ulong)(uint)(pIVar21->Windows).Size;
      }
      uVar36 = uVar36 + 1;
      iVar38 = (int)uVar34;
    } while (uVar36 != uVar34);
    uVar37 = (pIVar21->WindowsSortBuffer).Capacity;
  }
  iVar33 = (pIVar21->WindowsSortBuffer).Size;
  (pIVar21->WindowsSortBuffer).Size = iVar38;
  (pIVar21->Windows).Size = iVar33;
  (pIVar21->WindowsSortBuffer).Capacity = (pIVar21->Windows).Capacity;
  (pIVar21->Windows).Capacity = uVar37;
  ppIVar25 = (pIVar21->WindowsSortBuffer).Data;
  (pIVar21->WindowsSortBuffer).Data = (pIVar21->Windows).Data;
  (pIVar21->Windows).Data = ppIVar25;
  (pIVar21->IO).MetricsActiveWindows = pIVar21->WindowsActiveCount;
  ((pIVar21->IO).Fonts)->Locked = false;
  (pIVar21->IO).MouseWheel = 0.0;
  (pIVar21->IO).MouseWheelH = 0.0;
  if ((pIVar21->IO).InputQueueCharacters.Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (unsigned_short *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    puVar10 = (pIVar21->IO).InputQueueCharacters.Data;
    if (puVar10 != (unsigned_short *)0x0) {
      memcpy(__dest,puVar10,(long)(pIVar21->IO).InputQueueCharacters.Size * 2);
      puVar10 = (pIVar21->IO).InputQueueCharacters.Data;
      if ((puVar10 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar10,GImAllocatorUserData);
    }
    (pIVar21->IO).InputQueueCharacters.Data = __dest;
    (pIVar21->IO).InputQueueCharacters.Capacity = 0;
  }
  (pIVar21->IO).InputQueueCharacters.Size = 0;
  (pIVar21->IO).NavInputs[0] = 0.0;
  (pIVar21->IO).NavInputs[1] = 0.0;
  (pIVar21->IO).NavInputs[2] = 0.0;
  (pIVar21->IO).NavInputs[3] = 0.0;
  (pIVar21->IO).NavInputs[4] = 0.0;
  (pIVar21->IO).NavInputs[5] = 0.0;
  (pIVar21->IO).NavInputs[6] = 0.0;
  (pIVar21->IO).NavInputs[7] = 0.0;
  (pIVar21->IO).NavInputs[8] = 0.0;
  (pIVar21->IO).NavInputs[9] = 0.0;
  (pIVar21->IO).NavInputs[10] = 0.0;
  (pIVar21->IO).NavInputs[0xb] = 0.0;
  (pIVar21->IO).NavInputs[0xc] = 0.0;
  (pIVar21->IO).NavInputs[0xd] = 0.0;
  (pIVar21->IO).NavInputs[0xe] = 0.0;
  (pIVar21->IO).NavInputs[0xf] = 0.0;
  (pIVar21->IO).NavInputs[0x10] = 0.0;
  (pIVar21->IO).NavInputs[0x11] = 0.0;
  (pIVar21->IO).NavInputs[0x12] = 0.0;
  (pIVar21->IO).NavInputs[0x13] = 0.0;
  (pIVar21->IO).NavInputs[0x14] = 0.0;
  return;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);
    if (g.FrameCountEnded == g.FrameCount)          // Don't process EndFrame() multiple times.
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.PlatformIO.Platform_SetImeInputPos && (g.PlatformImeLastPos.x == FLT_MAX || ImLengthSqr(g.PlatformImePos - g.PlatformImeLastPos) > 0.0001f))
        if (g.PlatformImePosViewport && g.PlatformImePosViewport->PlatformWindowCreated)
        {
            g.PlatformIO.Platform_SetImeInputPos(g.PlatformImePosViewport, g.PlatformImePos);
            g.PlatformImeLastPos = g.PlatformImePos;
            g.PlatformImePosViewport = NULL;
        }

    ErrorCheckEndFrame();

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Draw modal whitening background on _other_ viewports than the one the modal is one
    EndFrameDrawDimmedBackgrounds();

    // Show CTRL+TAB list window
    if (g.NavWindowingTarget != NULL)
        NavUpdateWindowingOverlay();

    SetCurrentViewport(NULL, NULL);

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount)
    {
        g.DragDropWithinSourceOrTarget = true;
        SetTooltip("...");
        g.DragDropWithinSourceOrTarget = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Update user-facing viewport list (g.Viewports -> g.PlatformIO.Viewports after filtering out some)
    UpdateViewportsEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because childs may not exist yet
    g.WindowsSortBuffer.resize(0);
    g.WindowsSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsSortBuffer.Size);
    g.Windows.swap(g.WindowsSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));
}